

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzquad.cpp
# Opt level: O1

void __thiscall TPZIntTetra3D::Point(TPZIntTetra3D *this,int ip,TPZVec<double> *pos,REAL *w)

{
  int iVar1;
  ostream *this_00;
  long *plVar2;
  REAL RVar3;
  
  if (((-1 < ip) && (this->fIntKsi != (TPZIntRuleT3D *)0x0)) &&
     (iVar1 = (*(this->super_TPZIntPoints)._vptr_TPZIntPoints[3])(this), ip < iVar1)) {
    TPZIntRuleT3D::Loc(this->fIntKsi,ip,pos);
    RVar3 = TPZIntRuleT3D::W(this->fIntKsi,ip);
    *w = RVar3;
    return;
  }
  if (this->fIntKsi == (TPZIntRuleT3D *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Null Pointer passed to method ",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZIntTetra3D::Point(..)\n",0x19);
  }
  if ((-1 < ip) && (iVar1 = (*(this->super_TPZIntPoints)._vptr_TPZIntPoints[3])(this), ip < iVar1))
  {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ip = ",5);
  this_00 = (ostream *)std::ostream::operator<<(&std::cerr,ip);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,", Out of Range: 0 -> ",0x15);
  iVar1 = (*(this->super_TPZIntPoints)._vptr_TPZIntPoints[3])(this);
  plVar2 = (long *)std::ostream::operator<<(this_00,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return;
}

Assistant:

void TPZIntTetra3D::Point(int ip, TPZVec<REAL> &pos, REAL &w) const {
	if((fIntKsi) && ((ip >= 0) && (ip < NPoints()))) {
		fIntKsi->Loc(ip, pos);
		w = fIntKsi->W(ip);
		return;
	}
	if(!fIntKsi)
		PZError 	<< "Null Pointer passed to method " << "TPZIntTetra3D::Point(..)\n";
	if((ip < 0) || (ip >= NPoints()))
		PZError 	<< "ip = " << ip << ", Out of Range: 0 -> " << NPoints() << std::endl;
}